

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void av1_read_timing_info_header
               (aom_timing_info_t *timing_info,aom_internal_error_info *error,
               aom_read_bit_buffer *rb)

{
  uint32_t uVar1;
  aom_read_bit_buffer *in_RDX;
  aom_internal_error_info *in_RSI;
  uint32_t *in_RDI;
  uint32_t num_ticks_per_picture_minus_1;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  uVar1 = aom_rb_read_unsigned_literal
                    ((aom_read_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  *in_RDI = uVar1;
  uVar1 = aom_rb_read_unsigned_literal
                    ((aom_read_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  in_RDI[1] = uVar1;
  if ((*in_RDI == 0) || (in_RDI[1] == 0)) {
    aom_internal_error(in_RSI,AOM_CODEC_UNSUP_BITSTREAM,
                       "num_units_in_display_tick and time_scale must be greater than 0.");
  }
  uVar1 = aom_rb_read_bit(in_RDX);
  in_RDI[2] = uVar1;
  if (in_RDI[2] != 0) {
    uVar1 = aom_rb_read_uvlc(in_RDX);
    if (uVar1 == 0xffffffff) {
      aom_internal_error(in_RSI,AOM_CODEC_UNSUP_BITSTREAM,
                         "num_ticks_per_picture_minus_1 cannot be (1 << 32) - 1.");
    }
    in_RDI[3] = uVar1 + 1;
  }
  return;
}

Assistant:

void av1_read_timing_info_header(aom_timing_info_t *timing_info,
                                 struct aom_internal_error_info *error,
                                 struct aom_read_bit_buffer *rb) {
  timing_info->num_units_in_display_tick =
      aom_rb_read_unsigned_literal(rb,
                                   32);  // Number of units in a display tick
  timing_info->time_scale = aom_rb_read_unsigned_literal(rb, 32);  // Time scale
  if (timing_info->num_units_in_display_tick == 0 ||
      timing_info->time_scale == 0) {
    aom_internal_error(
        error, AOM_CODEC_UNSUP_BITSTREAM,
        "num_units_in_display_tick and time_scale must be greater than 0.");
  }
  timing_info->equal_picture_interval =
      aom_rb_read_bit(rb);  // Equal picture interval bit
  if (timing_info->equal_picture_interval) {
    const uint32_t num_ticks_per_picture_minus_1 = aom_rb_read_uvlc(rb);
    if (num_ticks_per_picture_minus_1 == UINT32_MAX) {
      aom_internal_error(
          error, AOM_CODEC_UNSUP_BITSTREAM,
          "num_ticks_per_picture_minus_1 cannot be (1 << 32) - 1.");
    }
    timing_info->num_ticks_per_picture = num_ticks_per_picture_minus_1 + 1;
  }
}